

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

bool __thiscall
vkt::texture::SampleVerifier::verifySampleFiltered
          (SampleVerifier *this,Vec4 *result,IVec3 *baseTexelHiIn,IVec3 *baseTexelLoIn,
          IVec3 *texelGridOffsetHiIn,IVec3 *texelGridOffsetLoIn,int layer,int levelHi,
          Vec2 *lodFracBounds,VkFilter filter,VkSamplerMipmapMode mipmapFilter,ostream *report)

{
  double dVar1;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  bool bVar5;
  deInt32 dVar6;
  ostream *poVar7;
  int level;
  long lVar8;
  float fVar9;
  float fVar10;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  deInt32 lodStepsMax;
  deInt32 lodStepsMin;
  Vec4 *local_198;
  double local_190;
  IVec3 baseTexelLo;
  IVec3 baseTexelHi;
  Vec4 idealSampleHiMin;
  Vec3 roundedWeightsLo;
  Vec4 idealSampleMax;
  Vec4 idealSampleLoMin;
  IVec3 texelGridOffsetLo;
  IVec3 texelGridOffsetHi;
  Vec4 idealSampleMin;
  Vec4 idealSampleLoMax;
  Vec4 idealSampleHiMax;
  Interval local_d8;
  Interval local_c0;
  Interval idealSample;
  Vec3 roundedWeightsHi;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  
  iVar2 = this->m_coordBits;
  iVar3 = this->m_mipmapBits;
  level = (uint)(levelHi < this->m_imParams->levels + -1) + levelHi;
  local_198 = result;
  tcu::Vector<int,_3>::Vector(&baseTexelHi,baseTexelHiIn);
  tcu::Vector<int,_3>::Vector(&baseTexelLo,baseTexelLoIn);
  tcu::Vector<int,_3>::Vector(&texelGridOffsetHi,texelGridOffsetHiIn);
  tcu::Vector<int,_3>::Vector(&texelGridOffsetLo,texelGridOffsetLoIn);
  lodStepsMin = 0;
  lodStepsMax = 0;
  getMipmapStepBounds(this,lodFracBounds,&lodStepsMin,&lodStepsMax);
  poVar7 = std::operator<<(report,"Testing at base texel ");
  poVar7 = tcu::operator<<(poVar7,&baseTexelHi);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = tcu::operator<<(poVar7,&baseTexelLo);
  poVar7 = std::operator<<(poVar7," offset ");
  poVar7 = tcu::operator<<(poVar7,&texelGridOffsetHi);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = tcu::operator<<(poVar7,&texelGridOffsetLo);
  std::operator<<(poVar7,"\n");
  tcu::Vector<float,_4>::Vector(&idealSampleHiMin);
  tcu::Vector<float,_4>::Vector(&idealSampleHiMax);
  tcu::Vector<float,_4>::Vector(&idealSampleLoMin);
  tcu::Vector<float,_4>::Vector(&idealSampleLoMax);
  if (filter == VK_FILTER_LINEAR) {
    util::wrapTexelGridCoordLinear
              (&baseTexelHi,&texelGridOffsetHi,this->m_coordBits,this->m_imParams->dim);
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      util::wrapTexelGridCoordLinear
                (&baseTexelLo,&texelGridOffsetLo,this->m_coordBits,this->m_imParams->dim);
    }
    tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&roundedWeightsLo);
    fVar9 = (float)(1 << ((byte)iVar2 & 0x1f));
    tcu::operator/((tcu *)&roundedWeightsHi,&roundedWeightsLo,fVar9);
    tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&idealSample);
    tcu::operator/((tcu *)&roundedWeightsLo,(Vector<float,_3> *)&idealSample,fVar9);
    poVar7 = std::operator<<(report,"Computed weights: ");
    poVar7 = tcu::operator<<(poVar7,(Vector<float,_3> *)&roundedWeightsHi);
    poVar7 = std::operator<<(poVar7,", ");
    poVar7 = tcu::operator<<(poVar7,(Vector<float,_3> *)&roundedWeightsLo);
    std::operator<<(poVar7,"\n");
    getFilteredSample(this,&baseTexelHi,&roundedWeightsHi,layer,levelHi,&idealSampleHiMin,
                      &idealSampleHiMax);
    poVar7 = std::operator<<(report,"Ideal hi sample: ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleHiMin);
    poVar7 = std::operator<<(poVar7," through ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleHiMax);
    std::operator<<(poVar7,"\n");
    if (mipmapFilter != VK_SAMPLER_MIPMAP_MODE_LINEAR) {
LAB_0078cce4:
      bVar5 = util::isInRange<4>(local_198,&idealSampleHiMin,&idealSampleHiMax);
      if (!bVar5) {
        std::operator<<(report,"Failed comparison\n");
        return false;
      }
      return true;
    }
    getFilteredSample(this,&baseTexelLo,&roundedWeightsLo,layer,level,&idealSampleLoMin,
                      &idealSampleLoMax);
    poVar7 = std::operator<<(report,"Ideal lo sample: ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleLoMin);
    poVar7 = std::operator<<(poVar7," through ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleLoMax);
    std::operator<<(poVar7,"\n");
  }
  else {
    fetchTexel(this,&baseTexelHi,layer,levelHi,VK_FILTER_NEAREST,&idealSampleHiMin,&idealSampleHiMax
              );
    poVar7 = std::operator<<(report,"Ideal hi sample: ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleHiMin);
    poVar7 = std::operator<<(poVar7," through ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleHiMax);
    std::operator<<(poVar7,"\n");
    if (mipmapFilter != VK_SAMPLER_MIPMAP_MODE_LINEAR) goto LAB_0078cce4;
    fetchTexel(this,&baseTexelLo,layer,level,VK_FILTER_NEAREST,&idealSampleLoMin,&idealSampleLoMax);
    poVar7 = std::operator<<(report,"Ideal lo sample: ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleLoMin);
    poVar7 = std::operator<<(poVar7," through ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleLoMax);
    std::operator<<(poVar7,"\n");
  }
  dVar4 = lodStepsMax;
  dVar6 = lodStepsMin;
  while( true ) {
    if (dVar4 < dVar6) {
      return false;
    }
    fVar9 = (float)dVar6 / (float)(1 << ((byte)iVar3 & 0x1f));
    poVar7 = std::operator<<(report,"Testing at mipmap weight ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar9);
    std::operator<<(poVar7,"\n");
    tcu::Vector<float,_4>::Vector(&idealSampleMin);
    tcu::Vector<float,_4>::Vector(&idealSampleMax);
    bVar5 = NAN(fVar9);
    local_1b8 = INFINITY;
    if (!bVar5) {
      local_1b8 = (double)fVar9;
    }
    local_1c0 = -INFINITY;
    if (!bVar5) {
      local_1c0 = (double)fVar9;
    }
    fVar9 = 1.0 - fVar9;
    local_1c8 = INFINITY;
    local_190 = -INFINITY;
    if (!NAN(fVar9)) {
      local_1c8 = (double)fVar9;
      local_190 = local_1c8;
    }
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
      dVar1 = (double)*(float *)((long)idealSampleLoMax.m_data + lVar8);
      roundedWeightsHi.m_data[0]._0_1_ = 0;
      unique0x100002e3 = SUB84(dVar1,0);
      unique0x100002db = (double)*(float *)((long)idealSampleLoMin.m_data + lVar8);
      unique0x100002e7 = (int)((ulong)dVar1 >> 0x20);
      roundedWeightsLo.m_data[0]._0_1_ = 0;
      dVar1 = (double)*(float *)((long)idealSampleHiMax.m_data + lVar8);
      unique0x10000307 = SUB84(dVar1,0);
      unique0x100002ff = (double)*(float *)((long)idealSampleHiMin.m_data + lVar8);
      unique0x1000030b = (int)((ulong)dVar1 >> 0x20);
      local_c0.m_lo = local_1b8;
      local_c0.m_hi = local_1c0;
      local_c0.m_hasNaN = bVar5;
      tcu::operator*(&local_60,&local_c0,(Interval *)&roundedWeightsHi);
      local_d8.m_lo = local_1c8;
      local_d8.m_hi = local_190;
      local_d8.m_hasNaN = NAN(fVar9);
      tcu::operator*(&local_78,&local_d8,(Interval *)&roundedWeightsLo);
      tcu::operator+(&local_48,&local_60,&local_78);
      tcu::FloatFormat::roundOut(&idealSample,&this->m_filteringPrecision,&local_48,false);
      fVar10 = (float)idealSample.m_hi;
      *(float *)((long)idealSampleMin.m_data + lVar8) = (float)idealSample.m_lo;
      *(float *)((long)idealSampleMax.m_data + lVar8) = fVar10;
    }
    poVar7 = std::operator<<(report,"Ideal sample: ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleMin);
    poVar7 = std::operator<<(poVar7," through ");
    poVar7 = tcu::operator<<(poVar7,&idealSampleMax);
    std::operator<<(poVar7,"\n");
    bVar5 = util::isInRange<4>(local_198,&idealSampleMin,&idealSampleMax);
    if (bVar5) break;
    std::operator<<(report,"Failed comparison\n");
    dVar6 = dVar6 + 1;
  }
  return true;
}

Assistant:

bool SampleVerifier::verifySampleFiltered (const Vec4&			result,
										   const IVec3&			baseTexelHiIn,
										   const IVec3&			baseTexelLoIn,
										   const IVec3&			texelGridOffsetHiIn,
										   const IVec3&			texelGridOffsetLoIn,
										   int					layer,
										   int					levelHi,
										   const Vec2&			lodFracBounds,
										   VkFilter				filter,
										   VkSamplerMipmapMode	mipmapFilter,
										   std::ostream&		report) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(levelHi < m_imParams.levels);

	const int	coordSteps			= 1 << m_coordBits;
	const int	lodSteps			= 1 << m_mipmapBits;
	const int	levelLo				= (levelHi < m_imParams.levels - 1) ? levelHi + 1 : levelHi;

	IVec3		baseTexelHi			= baseTexelHiIn;
	IVec3		baseTexelLo			= baseTexelLoIn;
	IVec3		texelGridOffsetHi	= texelGridOffsetHiIn;
	IVec3		texelGridOffsetLo	= texelGridOffsetLoIn;
	deInt32		lodStepsMin			= 0;
	deInt32		lodStepsMax			= 0;

	getMipmapStepBounds(lodFracBounds, lodStepsMin, lodStepsMax);

	report << "Testing at base texel " << baseTexelHi << ", " << baseTexelLo << " offset " << texelGridOffsetHi << ", " << texelGridOffsetLo << "\n";

	Vec4 idealSampleHiMin;
	Vec4 idealSampleHiMax;
	Vec4 idealSampleLoMin;
	Vec4 idealSampleLoMax;

	// Get ideal samples at steps at each mipmap level

	if (filter == VK_FILTER_LINEAR)
	{
		// Adjust texel grid coordinates for linear filtering
		wrapTexelGridCoordLinear(baseTexelHi, texelGridOffsetHi, m_coordBits, m_imParams.dim);

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			wrapTexelGridCoordLinear(baseTexelLo, texelGridOffsetLo, m_coordBits, m_imParams.dim);
		}

		const Vec3 roundedWeightsHi = texelGridOffsetHi.asFloat() / (float)coordSteps;
		const Vec3 roundedWeightsLo = texelGridOffsetLo.asFloat() / (float)coordSteps;

		report << "Computed weights: " << roundedWeightsHi << ", " << roundedWeightsLo << "\n";

	    getFilteredSample(baseTexelHi, roundedWeightsHi, layer, levelHi, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    getFilteredSample(baseTexelLo, roundedWeightsLo, layer, levelLo, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}
	else
	{
	    fetchTexel(baseTexelHi, layer, levelHi, VK_FILTER_NEAREST, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    fetchTexel(baseTexelLo, layer, levelLo, VK_FILTER_NEAREST, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}

	// Test ideal samples based on mipmap filtering mode

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		for (deInt32 lodStep = lodStepsMin; lodStep <= lodStepsMax; ++lodStep)
		{
			float weight = (float)lodStep / (float)lodSteps;

			report << "Testing at mipmap weight " << weight << "\n";

			Vec4 idealSampleMin;
			Vec4 idealSampleMax;

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval idealSampleLo(false, idealSampleLoMin[compNdx], idealSampleLoMax[compNdx]);
				const Interval idealSampleHi(false, idealSampleHiMin[compNdx], idealSampleHiMax[compNdx]);

				const Interval idealSample
					= m_filteringPrecision.roundOut(Interval(weight) * idealSampleLo + Interval(1.0f - weight) * idealSampleHi, false);

				idealSampleMin[compNdx] = (float)idealSample.lo();
				idealSampleMax[compNdx] = (float)idealSample.hi();
			}

			report << "Ideal sample: " << idealSampleMin << " through " << idealSampleMax << "\n";

			if (isInRange(result, idealSampleMin, idealSampleMax))
			{
				return true;
			}
			else
			{
				report << "Failed comparison\n";
			}
		}
	}
	else
	{
		if (isInRange(result, idealSampleHiMin, idealSampleHiMax))
		{
			return true;
		}
		else
		{
			report << "Failed comparison\n";
		}
	}

	return false;
}